

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaDec.c
# Opt level: O2

SRes LzmaDec_AllocateProbs2(CLzmaDec *p,CLzmaProps *propNew,ISzAllocPtr alloc)

{
  undefined1 uVar1;
  SRes SVar2;
  CLzmaProb *pCVar3;
  uint uVar4;
  
  uVar1 = propNew->lc;
  uVar4 = (0x300 << (propNew->lp + uVar1 & 0x1f)) + 0x7c0;
  if ((p->probs == (CLzmaProb *)0x0) || (SVar2 = 0, uVar4 != p->numProbs)) {
    (*alloc->Free)(alloc,p->probs);
    p->probs = (CLzmaProb *)0x0;
    pCVar3 = (CLzmaProb *)(*alloc->Alloc)(alloc,(ulong)uVar4 * 2);
    p->probs = pCVar3;
    if (pCVar3 == (CLzmaProb *)0x0) {
      SVar2 = 2;
    }
    else {
      p->probs_1664 = pCVar3 + 0x680;
      p->numProbs = uVar4;
      SVar2 = 0;
    }
  }
  return SVar2;
}

Assistant:

static SRes LzmaDec_AllocateProbs2(CLzmaDec *p, const CLzmaProps *propNew, ISzAllocPtr alloc)
{
  UInt32 numProbs = LzmaProps_GetNumProbs(propNew);
  if (!p->probs || numProbs != p->numProbs)
  {
    LzmaDec_FreeProbs(p, alloc);
    p->probs = (CLzmaProb *)ISzAlloc_Alloc(alloc, numProbs * sizeof(CLzmaProb));
    if (!p->probs)
      return SZ_ERROR_MEM;
    p->probs_1664 = p->probs + 1664;
    p->numProbs = numProbs;
  }
  return SZ_OK;
}